

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * getLinkedTargetsContent<cmLinkItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libraries,cmTarget *target,
                   cmTarget *headTarget,cmGeneratorExpressionContext *context,
                   cmGeneratorExpressionDAGChecker *dagChecker,string *interfacePropertyName)

{
  pointer pcVar1;
  string depString;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0.field_2._M_local_buf[0] = '\0';
  for (pcVar1 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pcVar1 != (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                super__Vector_impl_data._M_finish; pcVar1 = pcVar1 + 1) {
    if (pcVar1->Target != target && pcVar1->Target != (cmTarget *)0x0) {
      std::operator+(&local_90,&local_d0,"$<TARGET_PROPERTY:");
      std::operator+(&local_70,&local_90,&pcVar1->Target->Name);
      std::operator+(&local_50,&local_70,",");
      std::operator+(&local_b0,&local_50,interfacePropertyName);
      std::operator+(&local_110,&local_b0,">");
      std::__cxx11::string::append((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::assign((char *)&local_d0);
    }
  }
  if (local_f0._M_string_length != 0) {
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (&local_110,&local_f0,target->Makefile,context,headTarget,target,dagChecker);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  cmGeneratorExpression::StripEmptyListElements(&local_110,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

std::string
getLinkedTargetsContent(
  std::vector<T> const &libraries,
  cmTarget const* target,
  cmTarget const* headTarget,
  cmGeneratorExpressionContext *context,
  cmGeneratorExpressionDAGChecker *dagChecker,
  const std::string &interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (typename std::vector<T>::const_iterator it = libraries.begin();
       it != libraries.end(); ++it)
    {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (it->Target && it->Target != target)
      {
      depString +=
        sep + "$<TARGET_PROPERTY:" +
        it->Target->GetName() + "," + interfacePropertyName + ">";
      sep = ";";
      }
    }
  if(!depString.empty())
    {
    linkedTargetsContent =
        cmGeneratorExpressionNode::EvaluateDependentExpression(depString,
                                        target->GetMakefile(), context,
                                        headTarget, target, dagChecker);
    }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}